

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_unit.cpp
# Opt level: O0

void run(roaring_bitmap_t **rarray)

{
  roaring_bitmap_t *in_RDI;
  roaring_bitmap_t *r3;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  size_t i;
  undefined8 local_10;
  
  for (local_10 = 0; local_10 < 100; local_10 = local_10 + 1) {
    roaring_bitmap_copy(in_RDI);
    roaring_bitmap_copy(in_RDI);
    roaring_bitmap_copy(in_RDI);
    roaring_bitmap_and_inplace((roaring_bitmap_t *)rarray,(roaring_bitmap_t *)i);
    roaring_bitmap_andnot_inplace((roaring_bitmap_t *)rarray,(roaring_bitmap_t *)i);
    roaring_bitmap_free((roaring_bitmap_t *)0x1012ac);
    roaring_bitmap_free((roaring_bitmap_t *)0x1012b6);
    roaring_bitmap_free((roaring_bitmap_t *)0x1012bf);
  }
  return;
}

Assistant:

void run(roaring_bitmap_t **rarray) {
    for (size_t i = 0; i < 100; i++) {
        roaring_bitmap_t *r1 = roaring_bitmap_copy(rarray[0]);
        roaring_bitmap_t *r2 = roaring_bitmap_copy(rarray[1]);
        roaring_bitmap_t *r3 = roaring_bitmap_copy(rarray[2]);
        roaring_bitmap_and_inplace(r1, r2);
        roaring_bitmap_andnot_inplace(r1, r3);
        roaring_bitmap_free(r1);
        roaring_bitmap_free(r2);
        roaring_bitmap_free(r3);
    }
}